

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,Const *const_)

{
  byte bVar1;
  Enum EVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  char *pcVar5;
  float fVar6;
  string_view local_110;
  v128 local_fc;
  int local_ec;
  undefined1 auStack_e8 [4];
  int i;
  char local_d8 [8];
  char buf [128];
  uint64_t significand_1;
  char *sign_1;
  uint64_t f64_bits;
  char *pcStack_30;
  uint32_t significand;
  char *sign;
  Type TStack_20;
  uint32_t f32_bits;
  Const *local_18;
  Const *const__local;
  CWriter *this_local;
  
  local_18 = const_;
  const__local = (Const *)this;
  TStack_20 = Const::type(const_);
  EVar2 = Type::operator_cast_to_Enum(&stack0xffffffffffffffe0);
  switch(EVar2) {
  case V128:
    _auStack_e8 = Const::vec128(local_18);
    bVar1 = v128::u8((v128 *)auStack_e8,0);
    Writef(this,"v128_const(0x%02x",(ulong)bVar1);
    for (local_ec = 1; local_ec < 0x10; local_ec = local_ec + 1) {
      local_fc = Const::vec128(local_18);
      bVar1 = v128::u8(&local_fc,local_ec);
      Writef(this,", 0x%02x",(ulong)bVar1);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_110,")");
    Write(this,local_110);
    break;
  case F64:
    sign_1 = (char *)Const::f64_bits(local_18);
    if (((ulong)sign_1 & 0x7ff0000000000000) == 0x7ff0000000000000) {
      pcVar5 = "\n\n";
      if (((ulong)sign_1 & 0x8000000000000000) != 0) {
        pcVar5 = "  -";
      }
      if (((ulong)sign_1 & 0xfffffffffffff) == 0) {
        Writef(this,"%sINFINITY",pcVar5 + 2);
      }
      else {
        Writef(this,"f64_reinterpret_i64(0x%016lx) /* %snan:0x%013lx */",sign_1,pcVar5 + 2,
               (ulong)sign_1 & 0xfffffffffffff);
      }
    }
    else if (sign_1 == (char *)0x8000000000000000) {
      Writef(this,"-0.0");
    }
    else {
      Bitcast<double,unsigned_long&>((unsigned_long *)&sign_1);
      snprintf(local_d8,0x80,"%.17g");
      pcVar5 = strchr(local_d8,0x2e);
      if ((pcVar5 == (char *)0x0) && (pcVar5 = strchr(local_d8,0x65), pcVar5 == (char *)0x0)) {
        strcat(local_d8,".0");
      }
      Writef(this,"%s",local_d8);
    }
    break;
  case F32:
    sign._4_4_ = Const::f32_bits(local_18);
    if ((sign._4_4_ & 0x7f800000) == 0x7f800000) {
      pcStack_30 = "\n\n";
      if ((sign._4_4_ & 0x80000000) != 0) {
        pcStack_30 = "  -";
      }
      pcStack_30 = pcStack_30 + 2;
      f64_bits._4_4_ = sign._4_4_ & 0x7fffff;
      if (f64_bits._4_4_ == 0) {
        Writef(this,"%sINFINITY",pcStack_30);
      }
      else {
        Writef(this,"f32_reinterpret_i32(0x%08x) /* %snan:0x%06x */",(ulong)sign._4_4_,pcStack_30,
               (ulong)f64_bits._4_4_);
      }
    }
    else if (sign._4_4_ == 0x80000000) {
      Writef(this,"-0.f");
    }
    else {
      fVar6 = Bitcast<float,unsigned_int&>((uint *)((long)&sign + 4));
      Writef(this,"%.9g",(double)fVar6);
    }
    break;
  case I64:
    uVar4 = Const::u64(local_18);
    Writef(this,"%luull",uVar4);
    break;
  case I32:
    uVar3 = Const::u32(local_18);
    Writef(this,"%uu",(ulong)uVar3);
    break;
  default:
    abort();
  }
  return;
}

Assistant:

void CWriter::Write(const Const& const_) {
  switch (const_.type()) {
    case Type::I32:
      Writef("%uu", static_cast<int32_t>(const_.u32()));
      break;

    case Type::I64:
      Writef("%" PRIu64 "ull", static_cast<int64_t>(const_.u64()));
      break;

    case Type::F32: {
      uint32_t f32_bits = const_.f32_bits();
      // TODO(binji): Share with similar float info in interp.cc and literal.cc
      if ((f32_bits & 0x7f800000u) == 0x7f800000u) {
        const char* sign = (f32_bits & 0x80000000) ? "-" : "";
        uint32_t significand = f32_bits & 0x7fffffu;
        if (significand == 0) {
          // Infinity.
          Writef("%sINFINITY", sign);
        } else {
          // Nan.
          Writef("f32_reinterpret_i32(0x%08x) /* %snan:0x%06x */", f32_bits,
                 sign, significand);
        }
      } else if (f32_bits == 0x80000000) {
        // Negative zero. Special-cased so it isn't written as -0 below.
        Writef("-0.f");
      } else {
        Writef("%.9g", Bitcast<float>(f32_bits));
      }
      break;
    }

    case Type::F64: {
      uint64_t f64_bits = const_.f64_bits();
      // TODO(binji): Share with similar float info in interp.cc and literal.cc
      if ((f64_bits & 0x7ff0000000000000ull) == 0x7ff0000000000000ull) {
        const char* sign = (f64_bits & 0x8000000000000000ull) ? "-" : "";
        uint64_t significand = f64_bits & 0xfffffffffffffull;
        if (significand == 0) {
          // Infinity.
          Writef("%sINFINITY", sign);
        } else {
          // Nan.
          Writef("f64_reinterpret_i64(0x%016" PRIx64 ") /* %snan:0x%013" PRIx64
                 " */",
                 f64_bits, sign, significand);
        }
      } else if (f64_bits == 0x8000000000000000ull) {
        // Negative zero. Special-cased so it isn't written as -0 below.
        Writef("-0.0");
      } else {
        char buf[128];
        snprintf(buf, sizeof(buf), "%.17g", Bitcast<double>(f64_bits));
        // Append .0 if sprint didn't include a decimal point or use the
        // exponent ('e') form.  This is a workaround for an MSVC parsing
        // issue: https://github.com/WebAssembly/wabt/issues/2422
        if (!strchr(buf, '.') && !strchr(buf, 'e')) {
          strcat(buf, ".0");
        }
        Writef("%s", buf);
      }
      break;
    }
    case Type::V128: {
      Writef("v128_const(0x%02x", const_.vec128().u8(0));
      for (int i = 1; i < 16; i++) {
        Writef(", 0x%02x", const_.vec128().u8(i));
      }
      Write(")");
      break;
    }

    default:
      WABT_UNREACHABLE;
  }
}